

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O3

wchar_t create_dir(archive_write_disk *a,char *path)

{
  byte *pbVar1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  int *piVar5;
  fixup_entry *pfVar6;
  char *pcVar7;
  uint uVar8;
  uint __mode;
  stat_conflict st;
  stat sStack_b8;
  
  pcVar4 = strrchr(path,0x2f);
  pcVar7 = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = path;
  }
  if ((*pcVar7 == '\0') ||
     ((*pcVar7 == '.' && ((pcVar7[1] == '\0' || ((pcVar7[1] == '.' && (pcVar7[2] == '\0')))))))) {
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      wVar3 = create_dir(a,path);
      *pcVar4 = '/';
      return wVar3;
    }
LAB_001680de:
    wVar3 = L'\0';
  }
  else {
    iVar2 = stat(path,&sStack_b8);
    if (iVar2 == 0) {
      if ((sStack_b8.st_mode & 0xf000) == 0x4000) goto LAB_001680de;
      if ((a->flags & L'\b') == L'\0') {
        iVar2 = unlink(path);
        if (iVar2 == 0) goto LAB_00168118;
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        pcVar7 = "Can\'t create directory \'%s\': Conflicting file cannot be removed";
      }
      else {
        pcVar7 = "Can\'t create directory \'%s\'";
        iVar2 = 0x11;
      }
    }
    else {
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      if ((iVar2 == 2) || (iVar2 == 0x14)) {
        if (pcVar4 != (char *)0x0) {
          *pcVar4 = '\0';
          wVar3 = create_dir(a,path);
          *pcVar4 = '/';
          if (wVar3 != L'\0') {
            return wVar3;
          }
        }
LAB_00168118:
        uVar8 = a->user_umask;
        __mode = ~uVar8 & 0x3d | 0x1c0;
        iVar2 = mkdir(path,__mode);
        if (iVar2 == 0) {
          uVar8 = ~uVar8 & 0x1ff;
          if (__mode == uVar8) {
            return L'\0';
          }
          pfVar6 = new_fixup(a,path);
          if (pfVar6 != (fixup_entry *)0x0) {
            pbVar1 = (byte *)((long)&pfVar6->fixup + 3);
            *pbVar1 = *pbVar1 | 0x20;
            pfVar6->mode = uVar8;
            return L'\0';
          }
          return L'\xffffffe2';
        }
        iVar2 = stat(path,&sStack_b8);
        if ((iVar2 == 0) && ((sStack_b8.st_mode & 0xf000) == 0x4000)) goto LAB_001680de;
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        pcVar7 = "Failed to create dir \'%s\'";
      }
      else {
        pcVar7 = "Can\'t test directory \'%s\'";
      }
    }
    archive_set_error(&a->archive,iVar2,pcVar7,path);
    wVar3 = L'\xffffffe7';
  }
  return wVar3;
}

Assistant:

static int
create_dir(struct archive_write_disk *a, char *path)
{
	struct stat st;
	struct fixup_entry *le;
	char *slash, *base;
	mode_t mode_final, mode;
	int r;

	/* Check for special names and just skip them. */
	slash = strrchr(path, '/');
	if (slash == NULL)
		base = path;
	else
		base = slash + 1;

	if (base[0] == '\0' ||
	    (base[0] == '.' && base[1] == '\0') ||
	    (base[0] == '.' && base[1] == '.' && base[2] == '\0')) {
		/* Don't bother trying to create null path, '.', or '..'. */
		if (slash != NULL) {
			*slash = '\0';
			r = create_dir(a, path);
			*slash = '/';
			return (r);
		}
		return (ARCHIVE_OK);
	}

	/*
	 * Yes, this should be stat() and not lstat().  Using lstat()
	 * here loses the ability to extract through symlinks.  Also note
	 * that this should not use the a->st cache.
	 */
	if (la_stat(path, &st) == 0) {
		if (S_ISDIR(st.st_mode))
			return (ARCHIVE_OK);
		if ((a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE)) {
			archive_set_error(&a->archive, EEXIST,
			    "Can't create directory '%s'", path);
			return (ARCHIVE_FAILED);
		}
		if (unlink(path) != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't create directory '%s': "
			    "Conflicting file cannot be removed",
			    path);
			return (ARCHIVE_FAILED);
		}
	} else if (errno != ENOENT && errno != ENOTDIR) {
		/* Stat failed? */
		archive_set_error(&a->archive, errno,
		    "Can't test directory '%s'", path);
		return (ARCHIVE_FAILED);
	} else if (slash != NULL) {
		*slash = '\0';
		r = create_dir(a, path);
		*slash = '/';
		if (r != ARCHIVE_OK)
			return (r);
	}

	/*
	 * Mode we want for the final restored directory.  Per POSIX,
	 * implicitly-created dirs must be created obeying the umask.
	 * There's no mention whether this is different for privileged
	 * restores (which the rest of this code handles by pretending
	 * umask=0).  I've chosen here to always obey the user's umask for
	 * implicit dirs, even if _EXTRACT_PERM was specified.
	 */
	mode_final = DEFAULT_DIR_MODE & ~a->user_umask;
	/* Mode we want on disk during the restore process. */
	mode = mode_final;
	mode |= MINIMUM_DIR_MODE;
	mode &= MAXIMUM_DIR_MODE;
	if (mkdir(path, mode) == 0) {
		if (mode != mode_final) {
			le = new_fixup(a, path);
			if (le == NULL)
				return (ARCHIVE_FATAL);
			le->fixup |=TODO_MODE_BASE;
			le->mode = mode_final;
		}
		return (ARCHIVE_OK);
	}

	/*
	 * Without the following check, a/b/../b/c/d fails at the
	 * second visit to 'b', so 'd' can't be created.  Note that we
	 * don't add it to the fixup list here, as it's already been
	 * added.
	 */
	if (la_stat(path, &st) == 0 && S_ISDIR(st.st_mode))
		return (ARCHIVE_OK);

	archive_set_error(&a->archive, errno, "Failed to create dir '%s'",
	    path);
	return (ARCHIVE_FAILED);
}